

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

GLuint deqp::gls::LifetimeTests::details::replaceName(Type *type,GLuint oldName,TestLog *log)

{
  ostringstream *this;
  char cVar1;
  int iVar2;
  GLuint GVar3;
  undefined4 extraout_var;
  undefined1 local_198 [384];
  long *plVar4;
  
  iVar2 = (*type->_vptr_Type[6])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar4 != (long *)0x0) {
    cVar1 = (**(code **)(*plVar4 + 0x20))(plVar4);
    if (cVar1 == '\0') {
      this = (ostringstream *)(local_198 + 8);
      local_198._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"// Type does not require Gen* for binding, reusing old id ",0x3a);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,".",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
      return oldName;
    }
  }
  GVar3 = (*type->_vptr_Type[2])(type);
  return GVar3;
}

Assistant:

GLuint replaceName (Type& type, GLuint oldName, TestLog& log)
{
	const Binder* const	binder		= type.binder();
	const bool			genRequired	= binder == DE_NULL || binder->genRequired();

	if (genRequired)
		return type.gen();

	log << TestLog::Message
		<< "// Type does not require Gen* for binding, reusing old id " << oldName << "."
		<< TestLog::EndMessage;

	return oldName;
}